

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O3

err_t g12sSign(octet *sig,g12s_params *params,octet *hash,octet *privkey,gen_i rng,void *rng_stack)

{
  u64 *dest;
  u32 uVar1;
  size_t sVar2;
  word *pwVar3;
  octet *buf;
  word *pwVar4;
  err_t eVar5;
  bool_t bVar6;
  int iVar7;
  ulong uVar8;
  u64 *dest_00;
  ec_o *ec_00;
  u64 *dest_01;
  void *stack;
  uint uVar9;
  ulong n;
  ec_o *ec;
  ec_o *local_80;
  word *local_78;
  octet *local_70;
  u64 *local_68;
  word *local_60;
  u64 *local_58;
  ulong local_50;
  word *local_48;
  ulong local_40;
  void *local_38;
  ulong uVar10;
  
  local_80 = (ec_o *)0x0;
  eVar5 = 0x130;
  if ((rng != (gen_i)0x0) && (eVar5 = g12sEcCreate(&local_80,params,g12sSign_deep), eVar5 == 0)) {
    uVar1 = params->l;
    uVar9 = uVar1 + 7 >> 3;
    uVar10 = (ulong)uVar9;
    local_70 = sig;
    bVar6 = memIsValid(hash,uVar10);
    ec_00 = local_80;
    if ((bVar6 != 0) && (bVar6 = memIsValid(privkey,uVar10), ec_00 = local_80, bVar6 != 0)) {
      local_40 = (ulong)(uVar9 * 2);
      bVar6 = memIsValid(local_70,local_40);
      ec_00 = local_80;
      if (bVar6 != 0) {
        uVar9 = uVar1 + 0x3f >> 6;
        n = (ulong)uVar9;
        dest_01 = (u64 *)((long)&(local_80->hdr).keep + (local_80->hdr).keep);
        sVar2 = local_80->f->n;
        local_38 = rng_stack;
        u64From(dest_01,privkey,uVar10);
        bVar6 = wwIsZero(dest_01,n);
        if ((bVar6 != 0) || (iVar7 = wwCmp(dest_01,ec_00->order,n), -1 < iVar7)) {
          blobClose(ec_00);
          return 0x1f8;
        }
        uVar8 = (ulong)(uVar9 * 8);
        dest = (u64 *)((long)dest_01 + uVar8);
        local_78 = (word *)(uVar8 + (long)dest);
        local_48 = (word *)((long)local_78 + uVar8);
        dest_00 = local_48 + sVar2 * 2;
        local_60 = (word *)((long)dest_00 + uVar8);
        stack = (void *)(uVar8 + (long)local_60);
        local_58 = dest_01;
        memCopy(dest,hash,uVar10);
        memRev(dest,uVar10);
        u64From(dest,dest,uVar10);
        zzMod(dest,dest,n,ec_00->order,n,stack);
        bVar6 = wwIsZero(dest,n);
        pwVar4 = local_48;
        local_68 = dest;
        local_50 = uVar10;
        if (bVar6 != 0) {
          *dest = 1;
        }
        while( true ) {
          pwVar3 = local_78;
          bVar6 = zzRandNZMod(local_78,ec_00->order,n,rng,local_38);
          if (bVar6 == 0) {
            blobClose(ec_00);
            return 0x130;
          }
          bVar6 = ecMulA(pwVar4,ec_00->base,ec_00,pwVar3,n,stack);
          if (bVar6 == 0) break;
          (*ec_00->f->to)((octet *)pwVar4,pwVar4,ec_00->f,stack);
          u64From(dest_00,pwVar4,ec_00->f->no);
          zzMod(dest_00,dest_00,ec_00->f->n,ec_00->order,n,stack);
          uVar10 = local_50;
          bVar6 = wwIsZero(dest_00,n);
          pwVar3 = local_78;
          if (bVar6 == 0) {
            zzMulMod(local_78,local_78,local_68,ec_00->order,n,stack);
            pwVar4 = local_60;
            zzMulMod(local_60,dest_00,local_58,ec_00->order,n,stack);
            zzAddMod(pwVar4,pwVar4,pwVar3,ec_00->order,n);
            buf = local_70;
            u64To(local_70,uVar10,pwVar4);
            u64To(buf + uVar10,uVar10,dest_00);
            memRev(buf,local_40);
            blobClose(ec_00);
            return 0;
          }
        }
      }
    }
    blobClose(ec_00);
    eVar5 = 0x6d;
  }
  return eVar5;
}

Assistant:

err_t g12sSign(octet sig[], const g12s_params* params, const octet hash[],
	const octet privkey[], gen_i rng, void* rng_stack)
{
	err_t code;
	size_t m, mo;
	// состояние
	ec_o* ec = 0;
	word* d;		/* [m] личный ключ */
	word* e;		/* [m] обработанное хэш-значение */
	word* k;		/* [m] одноразовый ключ */
	word* C;		/* [2n] вспомогательная точка */
	word* r;		/* [m] первая (старшая) часть подписи */
	word* s;		/* [m] вторая часть подписи */
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = g12sEcCreate(&ec, params, g12sSign_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	m = W_OF_B(params->l);
	mo = O_OF_B(params->l);
	// проверить входные указатели
	if (!memIsValid(hash, mo) ||
		!memIsValid(privkey, mo) ||
		!memIsValid(sig, 2 * mo))
	{
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	e = d + m;
	k = e + m;
	C = k + m;
	r = C + 2 * ec->f->n;
	s = r + m;
	stack = s + m;
	// загрузить d
	wwFrom(d, privkey, mo);
	if (wwIsZero(d, m) || 
		wwCmp(d, ec->order, m) >= 0)
	{
		g12sEcClose(ec);
		return ERR_BAD_PRIVKEY;
	}
	// e <- hash \mod q
	memCopy(e, hash, mo);
	memRev(e, mo);
	wwFrom(e, e, mo);
	zzMod(e, e, m, ec->order, m, stack);
	// e == 0 => e <- 1
	if (wwIsZero(e, m))
		e[0] = 1;
	// k <-R {1,2,..., q - 1}
gen_k:
	if (!zzRandNZMod(k, ec->order, m, rng, rng_stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_RNG;
	}
	// C <- k P
	if (!ecMulA(C, ec->base, ec, k, m, stack))
	{
		// если params корректны, то этого быть не должно
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// r <- x_C \mod q
	qrTo((octet*)C, ecX(C), ec->f, stack);
	wwFrom(r, C, ec->f->no);
	zzMod(r, r, ec->f->n, ec->order, m, stack);
	// r == 0 => повторить генерацию k
	if (wwIsZero(r, m))
		goto gen_k;
	// s <- (rd + ke) \mod q
	zzMulMod(k, k, e, ec->order, m, stack);
	zzMulMod(s, r, d, ec->order, m, stack);
	zzAddMod(s, s, k, ec->order, m);
	// выгрузить ЭЦП
	wwTo(sig, mo, s);
	wwTo(sig + mo, mo, r);
	memRev(sig, 2 * mo);
	// все нормально
	g12sEcClose(ec);
	return ERR_OK;
}